

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera_source.c
# Opt level: O0

MPP_RET camera_source_put_frame(CamSource *ctx,RK_S32 idx)

{
  v4l2_buf_type vVar1;
  RK_S32 RVar2;
  undefined1 local_118 [8];
  v4l2_plane planes [1];
  undefined4 local_78;
  v4l2_buf_type type;
  v4l2_buffer buf;
  RK_S32 idx_local;
  CamSource *ctx_local;
  
  if (-1 < idx) {
    vVar1 = ctx->type;
    buf._84_4_ = idx;
    memset(planes[0].reserved + 9,0,0x58);
    memcpy(&local_78,planes[0].reserved + 9,0x58);
    buf.timecode.userbits[0] = '\x01';
    buf.timecode.userbits[1] = '\0';
    buf.timecode.userbits[2] = '\0';
    buf.timecode.userbits[3] = '\0';
    local_78 = buf._84_4_;
    if (vVar1 == V4L2_BUF_TYPE_VIDEO_CAPTURE_MPLANE) {
      buf._56_8_ = local_118;
      buf.m.offset = 1;
    }
    type = vVar1;
    RVar2 = camera_source_ioctl(ctx->fd,-0x3fa7a9f1,&local_78);
    if (RVar2 == -1) {
      _mpp_log_l(2,"camera_source","VIDIOC_QBUF\n","camera_source_put_frame");
    }
  }
  return MPP_OK;
}

Assistant:

MPP_RET camera_source_put_frame(CamSource *ctx, RK_S32 idx)
{
    struct v4l2_buffer buf;
    enum v4l2_buf_type type;

    if (idx < 0)
        return MPP_OK;

    type = ctx->type;
    buf = (struct v4l2_buffer) {0};
    buf.type   = type;
    buf.memory = V4L2_MEMORY_MMAP;
    buf.index  = idx;

    struct v4l2_plane planes[FMT_NUM_PLANES];
    if (V4L2_BUF_TYPE_VIDEO_CAPTURE_MPLANE == type) {
        buf.m.planes = planes;
        buf.length = FMT_NUM_PLANES;
    }

    // Tell kernel it's ok to overwrite this frame
    if (-1 == camera_source_ioctl(ctx->fd, VIDIOC_QBUF, &buf)) {
        mpp_err_f("VIDIOC_QBUF\n");
        return MPP_OK;
    }

    return MPP_OK;
}